

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluator.cpp
# Opt level: O2

Env * evaluator::Evaluator::extendFunctionEnv
                (GCPtr<symbols::FunctionObject> *function,
                vector<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_> *args)

{
  pointer ppIVar1;
  Env *this;
  Object *obj;
  long lVar2;
  long lVar3;
  string local_50;
  
  this = NewEnvironment(function->addr->env);
  lVar3 = 0;
  for (lVar2 = 0;
      ppIVar1 = (function->addr->parameters).
                super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      lVar2 < (int)((ulong)((long)(function->addr->parameters).
                                  super__Vector_base<ast::Identifier_*,_std::allocator<ast::Identifier_*>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar1) >> 3);
      lVar2 = lVar2 + 1) {
    std::__cxx11::string::string
              ((string *)&local_50,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (*(long *)((long)ppIVar1 + lVar3) + 0x20));
    obj = GCPtr<symbols::Object>::unref
                    ((GCPtr<symbols::Object> *)
                     ((long)&((args->
                              super__Vector_base<GCPtr<symbols::Object>,_std::allocator<GCPtr<symbols::Object>_>_>
                              )._M_impl.super__Vector_impl_data._M_start)->addr + lVar3));
    symbols::Env::put(this,&local_50,obj);
    std::__cxx11::string::~string((string *)&local_50);
    lVar3 = lVar3 + 8;
  }
  return this;
}

Assistant:

Env* Evaluator::extendFunctionEnv(GCPtr<FunctionObject>& function, std::vector<GCPtr<Object>>& args){
    auto env = NewEnvironment(function->env);
    for(int paramIndex{0}; paramIndex < (int)function->parameters.size(); paramIndex++){
        env->put(function->parameters[paramIndex]->tok.Literal, args[paramIndex].unref());
    }
    return env;
}